

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

type * __thiscall
duckdb::Deserializer::
Read<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  Expression *pEVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer *__ptr;
  long lVar4;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  Expression *local_30;
  
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*this->_vptr_Deserializer[8])(this);
  lVar4 = CONCAT44(extraout_var,iVar3);
  if (lVar4 != 0) {
    do {
      local_38._M_head_impl = (Expression *)0x0;
      iVar3 = (*this->_vptr_Deserializer[10])(this);
      if ((char)iVar3 != '\0') {
        (*this->_vptr_Deserializer[6])(this);
        Expression::Deserialize((Expression *)&stack0xffffffffffffffd0,this);
        pEVar2 = local_30;
        _Var1._M_head_impl = local_38._M_head_impl;
        local_30 = (Expression *)0x0;
        local_38._M_head_impl = pEVar2;
        if (_Var1._M_head_impl != (Expression *)0x0) {
          (*((_Var1._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          if (local_30 != (Expression *)0x0) {
            (*(local_30->super_BaseExpression)._vptr_BaseExpression[1])();
          }
        }
        (*this->_vptr_Deserializer[7])(this);
      }
      (*this->_vptr_Deserializer[0xb])(this);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_38);
      if (local_38._M_head_impl != (Expression *)0x0) {
        (*((local_38._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}